

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

ssize_t nghttp2_hd_inflate_hd2
                  (nghttp2_hd_inflater *inflater,nghttp2_nv *nv_out,int *inflate_flags,uint8_t *in,
                  size_t inlen,int in_final)

{
  ssize_t sVar1;
  nghttp2_hd_nv hd_nv;
  nghttp2_hd_nv local_28;
  
  sVar1 = nghttp2_hd_inflate_hd_nv(inflater,&local_28,inflate_flags,in,inlen,in_final);
  if ((-1 < sVar1) && ((*inflate_flags & 2) != 0)) {
    nv_out->name = (local_28.name)->base;
    nv_out->namelen = (local_28.name)->len;
    nv_out->value = (local_28.value)->base;
    nv_out->valuelen = (local_28.value)->len;
    nv_out->flags = local_28.flags;
  }
  return sVar1;
}

Assistant:

ssize_t nghttp2_hd_inflate_hd2(nghttp2_hd_inflater *inflater,
                               nghttp2_nv *nv_out, int *inflate_flags,
                               const uint8_t *in, size_t inlen, int in_final) {
  ssize_t rv;
  nghttp2_hd_nv hd_nv;

  rv = nghttp2_hd_inflate_hd_nv(inflater, &hd_nv, inflate_flags, in, inlen,
                                in_final);

  if (rv < 0) {
    return rv;
  }

  if (*inflate_flags & NGHTTP2_HD_INFLATE_EMIT) {
    nv_out->name = hd_nv.name->base;
    nv_out->namelen = hd_nv.name->len;

    nv_out->value = hd_nv.value->base;
    nv_out->valuelen = hd_nv.value->len;

    nv_out->flags = hd_nv.flags;
  }

  return rv;
}